

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

void * dmrC_allocator_allocate(allocator *A,size_t extra)

{
  allocation_blob *paVar1;
  ulong uVar2;
  ulong size_00;
  ulong uVar3;
  allocation_blob *newblob;
  size_t chunking;
  size_t offset;
  void **p;
  void *retval;
  allocation_blob *blob;
  size_t alignment;
  size_t size;
  size_t extra_local;
  allocator *A_local;
  
  uVar2 = extra + A->size_;
  uVar3 = (ulong)A->alignment_;
  paVar1 = A->blobs_;
  if (A->chunking_ < uVar2) {
    __assert_fail("size <= A->chunking_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/allocate.c"
                  ,0x4d,"void *dmrC_allocator_allocate(struct allocator *, size_t)");
  }
  if (A->freelist_ == (void *)0x0) {
    A->allocations = A->allocations + 1;
    A->useful_bytes = uVar2 + A->useful_bytes;
    uVar2 = (uVar2 + uVar3) - 1 & (uVar3 - 1 ^ 0xffffffffffffffff);
    if ((paVar1 == (allocation_blob *)0x0) || (retval = paVar1, paVar1->left < uVar2)) {
      size_00 = (ulong)A->chunking_;
      retval = dmrC_blob_alloc(size_00);
      if ((allocation_blob *)retval == (allocation_blob *)0x0) {
        fprintf(_stderr,"out of memory\n");
        abort();
      }
      A->total_bytes = size_00 + A->total_bytes;
      ((allocation_blob *)retval)->next = paVar1;
      A->blobs_ = (allocation_blob *)retval;
      uVar3 = uVar3 + 0x17 & (uVar3 - 1 ^ 0xffffffffffffffff);
      ((allocation_blob *)retval)->left = size_00 - uVar3;
      ((allocation_blob *)retval)->offset = uVar3 - 0x18;
    }
    A_local = (allocator *)((long)retval + *(long *)((long)retval + 0x10) + 0x18);
    *(ulong *)((long)retval + 0x10) = uVar2 + *(long *)((long)retval + 0x10);
    *(ulong *)((long)retval + 8) = *(long *)((long)retval + 8) - uVar2;
  }
  else {
    A_local = (allocator *)A->freelist_;
    A->freelist_ = A_local->name_;
    memset(A_local,0,uVar2);
  }
  return A_local;
}

Assistant:

void *dmrC_allocator_allocate(struct allocator *A, size_t extra) {
  size_t size = extra + A->size_;
  size_t alignment = A->alignment_;
  struct allocation_blob *blob = A->blobs_;
  void *retval;

  assert(size <= A->chunking_);
  /*
  * NOTE! The freelist only works with things that are
  *  (a) sufficiently aligned
  *  (b) use a constant size
  * Don't try to free allocators that don't follow
  * these rules.
  */
  if (A->freelist_) {
    void **p = (void **)A->freelist_;
    retval = p;
    A->freelist_ = *p;
    memset(retval, 0, size);
    return retval;
  }

  A->allocations++;
  A->useful_bytes += size;
  size = (size + alignment - 1) & ~(alignment - 1);
  if (!blob || blob->left < size) {
    size_t offset, chunking = A->chunking_;
    struct allocation_blob *newblob =
        (struct allocation_blob *)dmrC_blob_alloc(chunking);
    if (!newblob) {
      fprintf(stderr, "out of memory\n");
      abort();
    }
    A->total_bytes += chunking;
    newblob->next = blob;
    blob = newblob;
    A->blobs_ = newblob;
    offset = offsetof(struct allocation_blob, data);
    offset = (offset + alignment - 1) & ~(alignment - 1);
    blob->left = chunking - offset;
    blob->offset = offset - offsetof(struct allocation_blob, data);
  }
  retval = blob->data + blob->offset;
  blob->offset += size;
  blob->left -= size;
  return retval;
}